

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool __thiscall
CLI::App::_parse_single
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool *positional_only)

{
  bool bVar1;
  bool bVar2;
  Classifier current_type;
  HorribleError *this_00;
  allocator local_61;
  string local_60;
  string local_40;
  
  if (*positional_only == false) {
    current_type = _recognize(this,(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish + -1,true);
    switch(current_type) {
    case NONE:
      goto switchD_001327a2_caseD_0;
    case POSITIONAL_MARK:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(args);
      *positional_only = true;
      bVar2 = _has_remaining_positionals(this);
      if ((!bVar2) && (this->parent_ != (App *)0x0)) {
        return false;
      }
      ::std::__cxx11::string::string((string *)&local_60,"--",&local_61);
      _move_to_missing(this,POSITIONAL_MARK,&local_60);
      ::std::__cxx11::string::~string((string *)&local_60);
      break;
    case SHORT:
    case LONG:
    case WINDOWS:
      _parse_arg(this,args,current_type);
      break;
    case SUBCOMMAND:
      bVar2 = _parse_subcommand(this,args);
      return bVar2;
    case SUBCOMMAND_TERMINATOR:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(args);
      return false;
    default:
      this_00 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string
                ((string *)&local_40,"unrecognized classifier (you should not see this!)",
                 (allocator *)&local_60);
      HorribleError::HorribleError(this_00,&local_40);
      __cxa_throw(this_00,&HorribleError::typeinfo,Error::~Error);
    }
    bVar2 = true;
  }
  else {
switchD_001327a2_caseD_0:
    bVar2 = false;
    bVar1 = _parse_positional(this,args,false);
    if ((bVar1) && (bVar2 = true, this->positionals_at_end_ == true)) {
      *positional_only = true;
    }
  }
  return bVar2;
}

Assistant:

bool _parse_single(std::vector<std::string> &args, bool &positional_only) {
        bool retval = true;
        detail::Classifier classifier = positional_only ? detail::Classifier::NONE : _recognize(args.back());
        switch(classifier) {
        case detail::Classifier::POSITIONAL_MARK:
            args.pop_back();
            positional_only = true;
            if((!_has_remaining_positionals()) && (parent_ != nullptr)) {
                retval = false;
            } else {
                _move_to_missing(classifier, "--");
            }
            break;
        case detail::Classifier::SUBCOMMAND_TERMINATOR:
            // treat this like a positional mark if in the parent app
            args.pop_back();
            retval = false;
            break;
        case detail::Classifier::SUBCOMMAND:
            retval = _parse_subcommand(args);
            break;
        case detail::Classifier::LONG:
        case detail::Classifier::SHORT:
        case detail::Classifier::WINDOWS:
            // If already parsed a subcommand, don't accept options_
            _parse_arg(args, classifier);
            break;
        case detail::Classifier::NONE:
            // Probably a positional or something for a parent (sub)command
            retval = _parse_positional(args, false);
            if(retval && positionals_at_end_) {
                positional_only = true;
            }
            break;
            // LCOV_EXCL_START
        default:
            throw HorribleError("unrecognized classifier (you should not see this!)");
            // LCOV_EXCL_STOP
        }
        return retval;
    }